

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

char ** Qiniu_Region_Get_Rsf_Preferred_Hosts(Qiniu_Region *region,size_t *count)

{
  _Qiniu_Region_Service *p_Var1;
  char **ppcVar2;
  
  if (count != (size_t *)0x0) {
    *count = 0;
  }
  if ((((region != (Qiniu_Region *)0x0) &&
       (p_Var1 = region->rsfService, p_Var1 != (_Qiniu_Region_Service *)0x0)) &&
      (ppcVar2 = p_Var1->hosts, ppcVar2 != (char **)0x0)) && (p_Var1->preferredHostsCount != 0)) {
    if (count != (size_t *)0x0) {
      *count = p_Var1->preferredHostsCount;
    }
    return ppcVar2 + p_Var1->acceleratedHostsCount;
  }
  return (char **)0x0;
}

Assistant:

const char *const *Qiniu_Region_Get_Rsf_Preferred_Hosts(Qiniu_Region *region, size_t *count)
{
    if (count != NULL)
    {
        *count = 0;
    }
    if (region == NULL)
    {
        return NULL;
    }
    if (region->rsfService == NULL)
    {
        return NULL;
    }
    if (region->rsfService->hosts == NULL || region->rsfService->preferredHostsCount == 0)
    {
        return NULL;
    }
    if (count != NULL)
    {
        *count = region->rsfService->preferredHostsCount;
    }
    return region->rsfService->hosts + region->rsfService->acceleratedHostsCount;
}